

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O1

CURLcode Curl_convert_clone(Curl_easy *data,char *indata,size_t insize,char **outbuf)

{
  CURLcode CVar1;
  char *__dest;
  
  __dest = (char *)(*Curl_cmalloc)(insize);
  if (__dest == (char *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    memcpy(__dest,indata,insize);
    *outbuf = __dest;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_convert_clone(struct Curl_easy *data,
                            const char *indata,
                            size_t insize,
                            char **outbuf)
{
  char *convbuf;
  (void)data;

  convbuf = malloc(insize);
  if(!convbuf)
    return CURLE_OUT_OF_MEMORY;

  memcpy(convbuf, indata, insize);
  *outbuf = convbuf;
  return CURLE_OK;
}